

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_gather.c
# Opt level: O1

REF_STATUS ref_gather_node_scalar_bin(REF_NODE ref_node,REF_INT ldim,REF_DBL *scalar,FILE *file)

{
  REF_MPI ref_mpi;
  FILE *__s;
  int iVar1;
  uint uVar2;
  uint uVar3;
  void *__s_00;
  void *output;
  clock_t cVar4;
  size_t sVar5;
  long lVar6;
  undefined8 uVar7;
  ulong uVar8;
  REF_STATUS ref_private_macro_code_rxs;
  uint uVar9;
  uint uVar10;
  char *pcVar11;
  undefined8 *puVar12;
  int iVar13;
  ulong uVar14;
  long lVar15;
  void *pvVar16;
  REF_STATUS RVar17;
  double dVar18;
  REF_INT local;
  uint local_110;
  double local_108;
  double local_100;
  long local_f8;
  uint local_d4;
  double local_c8;
  long local_c0;
  long local_b8;
  long local_b0;
  int local_9c;
  long local_98;
  FILE *local_90;
  ulong local_88;
  undefined8 *local_80;
  ulong local_78;
  void *local_70;
  long local_68;
  ulong local_60;
  ulong local_58;
  long local_50;
  size_t local_48;
  REF_DBL *local_40;
  size_t local_38;
  
  ref_mpi = ref_node->ref_mpi;
  uVar10 = (int)(ref_node->old_n_global / (long)ref_mpi->n) + 1;
  iVar13 = ref_mpi->reduce_byte_limit;
  iVar1 = 0x7fffffff;
  if (0 < iVar13) {
    iVar1 = iVar13 / (ldim * 8 + 8);
  }
  uVar2 = 0x7fffffff;
  if ((int)uVar10 < iVar1) {
    uVar2 = uVar10;
  }
  if ((0 < iVar13) && (iVar1 <= (int)uVar10)) {
    uVar2 = iVar13 / (ldim * 8 + 8);
  }
  uVar10 = ldim + 1;
  uVar9 = uVar2 * uVar10;
  if ((int)uVar9 < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",0x67d,
           "ref_gather_node_scalar_bin","malloc local_xyzm of REF_DBL negative");
    RVar17 = 1;
  }
  else {
    local_88 = (ulong)uVar9;
    sVar5 = local_88 * 8;
    __s_00 = malloc(sVar5);
    if (__s_00 == (void *)0x0) {
      pcVar11 = "malloc local_xyzm of REF_DBL NULL";
      uVar7 = 0x67d;
    }
    else {
      output = malloc(sVar5);
      if (output != (void *)0x0) {
        lVar15 = ref_node->old_n_global;
        if (lVar15 < 1) {
          local_d4 = 0;
          local_100 = 0.0;
          local_108 = 0.0;
          local_c8 = 0.0;
        }
        else {
          local_98 = (long)(int)uVar2;
          local_88 = local_88 << 3;
          local_38 = (ulong)uVar10 << 3;
          local_78 = (ulong)(uint)ldim;
          local_48 = local_78 * 8;
          local_50 = (long)ldim;
          local_80 = (undefined8 *)((long)__s_00 + local_50 * 8);
          local_70 = (void *)((long)output + local_50 * 8);
          local_d4 = 0;
          lVar6 = 0;
          local_c0 = 0;
          local_b8 = 0;
          local_b0 = 0;
          local_f8 = 0;
          local_90 = (FILE *)file;
          local_68 = (long)(int)uVar10;
          local_40 = scalar;
          do {
            uVar14 = lVar15 - lVar6 & 0xffffffff;
            if (local_98 < lVar15 - lVar6) {
              uVar14 = (ulong)uVar2;
            }
            if (1 < ref_mpi->timing) {
              local_f8 = clock();
            }
            if (uVar9 != 0) {
              memset(__s_00,0,local_88);
            }
            iVar13 = (int)uVar14;
            local_60 = uVar14;
            if (0 < iVar13) {
              uVar8 = 0;
              puVar12 = local_80;
              lVar15 = lVar6;
              do {
                uVar3 = ref_node_local(ref_node,lVar15,&local_9c);
                if ((uVar3 != 0) && (uVar3 != 5)) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                         ,0x68f,"ref_gather_node_scalar_bin",(ulong)uVar3,"node local failed");
                  local_110 = uVar3;
                }
                pvVar16 = (void *)((long)__s_00 + uVar8 * 8);
                if (uVar3 == 5) {
LAB_00199fde:
                  if (-1 < ldim) {
                    memset(pvVar16,0,local_38);
                  }
                }
                else {
                  if (uVar3 != 0) {
                    return local_110;
                  }
                  if (ref_mpi->id != ref_node->part[local_9c]) goto LAB_00199fde;
                  if (0 < ldim) {
                    memcpy(pvVar16,local_40 + local_9c * local_50,local_48);
                  }
                  *puVar12 = 0x3ff0000000000000;
                }
                uVar8 = (ulong)((int)uVar8 + uVar10);
                puVar12 = puVar12 + (int)uVar10;
                lVar15 = lVar15 + 1;
                uVar14 = uVar14 - 1;
              } while (uVar14 != 0);
            }
            if (1 < ref_mpi->timing) {
              cVar4 = clock();
              local_b0 = (local_b0 - local_f8) + cVar4;
            }
            __s = local_90;
            if (1 < ref_mpi->timing) {
              local_f8 = clock();
            }
            uVar3 = ref_mpi_sum(ref_mpi,__s_00,output,iVar13 * uVar10,3);
            if (uVar3 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                     ,0x69e,"ref_gather_node_scalar_bin",(ulong)uVar3,"sum");
              return uVar3;
            }
            if (1 < ref_mpi->timing) {
              cVar4 = clock();
              local_b8 = (local_b8 - local_f8) + cVar4;
            }
            if (1 < ref_mpi->timing) {
              local_f8 = clock();
            }
            if ((ref_mpi->id == 0) && (0 < iVar13)) {
              uVar3 = 0;
              uVar14 = 0;
              do {
                uVar8 = (ulong)uVar3;
                dVar18 = *(double *)((long)local_70 + uVar14 * local_68 * 8) + -1.0;
                if (dVar18 <= -dVar18) {
                  dVar18 = -dVar18;
                }
                if (0.1 < dVar18) {
                  printf("error gather node %ld %f\n");
                }
                local_58 = uVar8;
                if (0 < ldim) {
                  pvVar16 = (void *)((long)output + uVar8 * 8);
                  uVar8 = local_78;
                  do {
                    sVar5 = fwrite(pvVar16,8,1,__s);
                    if (sVar5 != 1) {
                      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                             ,0x6ab,"ref_gather_node_scalar_bin","s",1,sVar5);
                      return 1;
                    }
                    pvVar16 = (void *)((long)pvVar16 + 8);
                    uVar8 = uVar8 - 1;
                  } while (uVar8 != 0);
                }
                uVar14 = uVar14 + 1;
                uVar3 = (int)local_58 + uVar10;
              } while (uVar14 != local_60);
            }
            if (1 < ref_mpi->timing) {
              cVar4 = clock();
              local_c0 = (local_c0 - local_f8) + cVar4;
            }
            local_d4 = local_d4 + 1;
            lVar6 = lVar6 + iVar13;
            lVar15 = ref_node->old_n_global;
          } while (lVar6 < lVar15);
          local_100 = (double)local_b0;
          local_108 = (double)local_b8;
          local_c8 = (double)local_c0;
        }
        free(output);
        free(__s_00);
        if (1 < ref_mpi->timing) {
          printf(" local %f mpi %f disk %f rank %d\n",local_100 / 1000000.0,local_108 / 1000000.0,
                 local_c8 / 1000000.0,(ulong)(uint)ref_mpi->id);
        }
        if (ref_mpi->reduce_byte_limit < 1) {
          uVar10 = 0x7fffffff;
        }
        else {
          uVar10 = ref_mpi->reduce_byte_limit / (int)(uVar10 * 8);
        }
        if (uVar2 != uVar10) {
          return 0;
        }
        if (ref_mpi->id != 0) {
          return 0;
        }
        printf("mpi reduce limited to %d chunks of %d bytes\n",(ulong)local_d4,(ulong)(uVar9 * 8));
        return 0;
      }
      pcVar11 = "malloc xyzm of REF_DBL NULL";
      uVar7 = 0x67e;
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",uVar7,
           "ref_gather_node_scalar_bin",pcVar11);
    RVar17 = 2;
  }
  return RVar17;
}

Assistant:

REF_FCN static REF_STATUS ref_gather_node_scalar_bin(REF_NODE ref_node,
                                                     REF_INT ldim,
                                                     REF_DBL *scalar,
                                                     FILE *file) {
  REF_MPI ref_mpi = ref_node_mpi(ref_node);
  REF_INT chunk, nchunk;
  REF_DBL *local_xyzm, *xyzm;
  REF_GLOB global, nnode_written, first;
  REF_INT local, n, i, im;
  REF_STATUS status;
  clock_t tic = 0;
  clock_t local_toc = 0;
  clock_t mpi_toc = 0;
  clock_t disk_toc = 0;

  chunk = (REF_INT)(ref_node_n_global(ref_node) / ref_mpi_n(ref_mpi) + 1);
  chunk = MIN(chunk, ref_mpi_reduce_chunk_limit(
                         ref_mpi, (ldim + 1) * (REF_INT)sizeof(REF_DBL)));

  ref_malloc(local_xyzm, (ldim + 1) * chunk, REF_DBL);
  ref_malloc(xyzm, (ldim + 1) * chunk, REF_DBL);

  nchunk = 0;
  nnode_written = 0;
  while (nnode_written < ref_node_n_global(ref_node)) {
    nchunk++;
    first = nnode_written;
    n = (REF_INT)MIN((REF_GLOB)chunk,
                     ref_node_n_global(ref_node) - nnode_written);

    nnode_written += n;
    if (1 < ref_mpi_timing(ref_mpi)) tic = clock();
    for (i = 0; i < (ldim + 1) * chunk; i++) local_xyzm[i] = 0.0;

    for (i = 0; i < n; i++) {
      global = first + i;
      status = ref_node_local(ref_node, global, &local);
      RXS(status, REF_NOT_FOUND, "node local failed");
      if (REF_SUCCESS == status &&
          ref_mpi_rank(ref_mpi) == ref_node_part(ref_node, local)) {
        for (im = 0; im < ldim; im++)
          local_xyzm[im + (ldim + 1) * i] = scalar[im + ldim * local];
        local_xyzm[ldim + (ldim + 1) * i] = 1.0;
      } else {
        for (im = 0; im < (ldim + 1); im++)
          local_xyzm[im + (ldim + 1) * i] = 0.0;
      }
    }
    if (1 < ref_mpi_timing(ref_mpi)) local_toc += (clock() - tic);

    if (1 < ref_mpi_timing(ref_mpi)) tic = clock();
    RSS(ref_mpi_sum(ref_mpi, local_xyzm, xyzm, (ldim + 1) * n, REF_DBL_TYPE),
        "sum");
    if (1 < ref_mpi_timing(ref_mpi)) mpi_toc += (clock() - tic);

    if (1 < ref_mpi_timing(ref_mpi)) tic = clock();
    if (ref_mpi_once(ref_mpi))
      for (i = 0; i < n; i++) {
        if (ABS(xyzm[ldim + (ldim + 1) * i] - 1.0) > 0.1) {
          printf("error gather node " REF_GLOB_FMT " %f\n", first + i,
                 xyzm[ldim + (ldim + 1) * i]);
        }
        for (im = 0; im < ldim; im++) {
          REIS(1,
               fwrite(&(xyzm[im + (ldim + 1) * i]), sizeof(REF_DBL), 1, file),
               "s");
        }
      }
    if (1 < ref_mpi_timing(ref_mpi)) disk_toc += (clock() - tic);
  }

  ref_free(xyzm);
  ref_free(local_xyzm);

  if (1 < ref_mpi_timing(ref_mpi)) {
    printf(" local %f mpi %f disk %f rank %d\n",
           ((REF_DBL)local_toc) / ((REF_DBL)CLOCKS_PER_SEC),
           ((REF_DBL)mpi_toc) / ((REF_DBL)CLOCKS_PER_SEC),
           ((REF_DBL)disk_toc) / ((REF_DBL)CLOCKS_PER_SEC),
           ref_mpi_rank(ref_mpi));
  }

  if (chunk == ref_mpi_reduce_chunk_limit(
                   ref_mpi, (ldim + 1) * (REF_INT)sizeof(REF_DBL))) {
    if (ref_mpi_once(ref_mpi)) {
      printf("mpi reduce limited to %d chunks of %d bytes\n", nchunk,
             chunk * (ldim + 1) * (REF_INT)sizeof(REF_DBL));
    }
  }

  return REF_SUCCESS;
}